

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O1

void cftb1st(int n,double *a,double *w)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  
  iVar8 = n >> 3;
  uVar3 = iVar8 * 2;
  dVar25 = *a + a[iVar8 * 4];
  iVar1 = iVar8 * 4 + 1;
  dVar23 = -a[1] - a[iVar1];
  dVar17 = *a - a[iVar8 * 4];
  dVar20 = a[iVar1] - a[1];
  dVar30 = a[(int)uVar3] + a[iVar8 * 6];
  iVar2 = iVar8 * 2 + 1;
  iVar12 = iVar8 * 6 + 1;
  dVar37 = a[iVar2] + a[iVar12];
  dVar27 = a[(int)uVar3] - a[iVar8 * 6];
  dVar33 = a[iVar2] - a[iVar12];
  *a = dVar25 + dVar30;
  a[1] = dVar23 - dVar37;
  a[(int)uVar3] = dVar25 - dVar30;
  a[iVar2] = dVar37 + dVar23;
  a[iVar8 * 4] = dVar17 + dVar33;
  a[iVar1] = dVar20 + dVar27;
  a[iVar8 * 6] = dVar17 - dVar33;
  a[iVar12] = dVar20 - dVar27;
  dVar17 = w[1];
  dVar20 = w[2];
  dVar23 = w[3];
  lVar4 = (long)(iVar8 + -2);
  if (iVar8 < 5) {
    dVar27 = 0.0;
    dVar25 = 1.0;
    dVar30 = 1.0;
    dVar33 = 0.0;
  }
  else {
    uVar5 = (ulong)uVar3;
    lVar9 = uVar5 - 1;
    lVar13 = uVar5 * 0x10 + -8;
    lVar14 = uVar5 * 0x18 + -8;
    lVar7 = uVar5 * 0x20 + -8;
    lVar6 = uVar5 + 5;
    lVar11 = uVar5 * 0x10 + 0x28;
    lVar15 = uVar5 * 0x18 + 0x28;
    lVar10 = 4;
    dVar37 = 0.0;
    dVar40 = 1.0;
    dVar19 = 1.0;
    dVar22 = 0.0;
    do {
      dVar41 = *(double *)((long)a + lVar11 + -0x18);
      dVar42 = *(double *)((long)a + lVar11 + -0x10);
      dVar24 = a[lVar10 + -2] + dVar41;
      dVar21 = -a[lVar10 + -1] - dVar42;
      dVar41 = a[lVar10 + -2] - dVar41;
      dVar42 = dVar42 - a[lVar10 + -1];
      dVar26 = *(double *)((long)a + lVar11 + -8);
      dVar39 = a[lVar10] + dVar26;
      dVar28 = -a[lVar10 + 1] - *(double *)((long)a + lVar11);
      dVar26 = a[lVar10] - dVar26;
      dVar44 = *(double *)((long)a + lVar11) - a[lVar10 + 1];
      dVar31 = *(double *)((long)a + lVar15 + -0x18);
      dVar29 = a[lVar6 + -3] + dVar31;
      dVar31 = a[lVar6 + -3] - dVar31;
      dVar34 = *(double *)((long)a + lVar15 + -0x10);
      dVar32 = a[lVar6 + -2] + dVar34;
      dVar34 = a[lVar6 + -2] - dVar34;
      dVar36 = *(double *)((long)a + lVar15 + -8);
      dVar18 = a[lVar6 + -1] + dVar36;
      dVar36 = a[lVar6 + -1] - dVar36;
      dVar35 = a[lVar6] + *(double *)((long)a + lVar15);
      dVar38 = a[lVar6] - *(double *)((long)a + lVar15);
      dVar25 = w[lVar10];
      dVar27 = w[lVar10 + 1];
      dVar30 = w[lVar10 + 2];
      dVar33 = w[lVar10 + 3];
      a[lVar10 + -2] = dVar24 + dVar29;
      a[lVar10 + -1] = dVar21 - dVar32;
      a[lVar10] = dVar39 + dVar18;
      a[lVar10 + 1] = dVar28 - dVar35;
      a[lVar6 + -3] = dVar24 - dVar29;
      a[lVar6 + -2] = dVar32 + dVar21;
      a[lVar6 + -1] = dVar39 - dVar18;
      a[lVar6] = dVar35 + dVar28;
      dVar35 = (dVar19 + dVar25) * dVar20;
      dVar39 = (dVar22 + dVar27) * dVar20;
      dVar19 = dVar41 + dVar34;
      dVar22 = dVar42 + dVar31;
      *(double *)((long)a + lVar11 + -0x18) = dVar35 * dVar19 - dVar22 * dVar39;
      *(double *)((long)a + lVar11 + -0x10) = dVar19 * dVar39 + dVar35 * dVar22;
      dVar19 = dVar26 + dVar38;
      dVar22 = dVar44 + dVar36;
      *(double *)((long)a + lVar11 + -8) = dVar25 * dVar19 - dVar22 * dVar27;
      *(double *)((long)a + lVar11) = dVar19 * dVar27 + dVar25 * dVar22;
      dVar18 = (dVar40 + dVar30) * dVar23;
      dVar21 = (dVar37 + dVar33) * dVar23;
      dVar41 = dVar41 - dVar34;
      dVar42 = dVar42 - dVar31;
      *(double *)((long)a + lVar15 + -0x18) = dVar18 * dVar41 + dVar21 * dVar42;
      *(double *)((long)a + lVar15 + -0x10) = dVar42 * dVar18 - dVar41 * dVar21;
      dVar26 = dVar26 - dVar38;
      dVar44 = dVar44 - dVar36;
      *(double *)((long)a + lVar15 + -8) = dVar30 * dVar26 + dVar33 * dVar44;
      *(double *)((long)a + lVar15) = dVar44 * dVar30 - dVar26 * dVar33;
      dVar37 = *(double *)((long)a + lVar14 + -8);
      dVar44 = a[lVar9 + -1] + dVar37;
      dVar31 = -a[lVar9] - *(double *)((long)a + lVar14);
      dVar37 = a[lVar9 + -1] - dVar37;
      dVar43 = *(double *)((long)a + lVar14) - a[lVar9];
      dVar40 = *(double *)((long)a + lVar14 + -0x18);
      dVar34 = a[lVar9 + -3] + dVar40;
      dVar40 = a[lVar9 + -3] - dVar40;
      dVar19 = *(double *)((long)a + lVar14 + -0x10);
      dVar36 = -a[lVar9 + -2] - dVar19;
      dVar19 = dVar19 - a[lVar9 + -2];
      dVar22 = *(double *)((long)a + lVar13 + -8);
      dVar41 = *(double *)((long)a + lVar7 + -8);
      dVar24 = dVar22 + dVar41;
      dVar22 = dVar22 - dVar41;
      dVar28 = *(double *)((long)a + lVar13) + *(double *)((long)a + lVar7);
      dVar29 = *(double *)((long)a + lVar13) - *(double *)((long)a + lVar7);
      dVar41 = *(double *)((long)a + lVar13 + -0x18);
      dVar42 = *(double *)((long)a + lVar7 + -0x18);
      dVar32 = dVar41 + dVar42;
      dVar41 = dVar41 - dVar42;
      dVar42 = *(double *)((long)a + lVar13 + -0x10);
      dVar26 = *(double *)((long)a + lVar7 + -0x10);
      dVar38 = dVar42 + dVar26;
      dVar42 = dVar42 - dVar26;
      a[lVar9 + -1] = dVar44 + dVar24;
      a[lVar9] = dVar31 - dVar28;
      a[lVar9 + -3] = dVar34 + dVar32;
      a[lVar9 + -2] = dVar36 - dVar38;
      *(double *)((long)a + lVar13 + -8) = dVar44 - dVar24;
      *(double *)((long)a + lVar13) = dVar28 + dVar31;
      *(double *)((long)a + lVar13 + -0x18) = dVar34 - dVar32;
      *(double *)((long)a + lVar13 + -0x10) = dVar38 + dVar36;
      dVar26 = dVar37 + dVar29;
      dVar31 = dVar43 + dVar22;
      *(double *)((long)a + lVar14 + -8) = dVar39 * dVar26 - dVar31 * dVar35;
      *(double *)((long)a + lVar14) = dVar31 * dVar39 + dVar26 * dVar35;
      dVar26 = dVar40 + dVar42;
      dVar31 = dVar19 + dVar41;
      *(double *)((long)a + lVar14 + -0x18) = dVar27 * dVar26 - dVar31 * dVar25;
      *(double *)((long)a + lVar14 + -0x10) = dVar26 * dVar25 + dVar27 * dVar31;
      dVar37 = dVar37 - dVar29;
      dVar43 = dVar43 - dVar22;
      *(double *)((long)a + lVar7 + -8) = dVar21 * dVar37 + dVar18 * dVar43;
      *(double *)((long)a + lVar7) = dVar43 * dVar21 - dVar37 * dVar18;
      dVar40 = dVar40 - dVar42;
      dVar19 = dVar19 - dVar41;
      *(double *)((long)a + lVar7 + -0x18) = dVar33 * dVar40 + dVar30 * dVar19;
      *(double *)((long)a + lVar7 + -0x10) = dVar19 * dVar33 - dVar40 * dVar30;
      lVar9 = lVar9 + -4;
      lVar13 = lVar13 + -0x20;
      lVar14 = lVar14 + -0x20;
      lVar7 = lVar7 + -0x20;
      lVar6 = lVar6 + 4;
      lVar11 = lVar11 + 0x20;
      lVar15 = lVar15 + 0x20;
      lVar16 = lVar10 + 2;
      lVar10 = lVar10 + 4;
      dVar37 = dVar33;
      dVar40 = dVar30;
      dVar19 = dVar25;
      dVar22 = dVar27;
    } while (lVar16 < lVar4);
  }
  dVar42 = (dVar25 + dVar17) * dVar20;
  dVar20 = (dVar27 + dVar17) * dVar20;
  dVar41 = (dVar30 - dVar17) * dVar23;
  dVar23 = (dVar33 - dVar17) * dVar23;
  lVar13 = (long)(iVar8 * 5);
  dVar37 = a[lVar4] + a[lVar13 + -2];
  dVar40 = -a[(long)iVar8 + -1] - a[lVar13 + -1];
  dVar25 = a[lVar4] - a[lVar13 + -2];
  dVar27 = a[lVar13 + -1] - a[(long)iVar8 + -1];
  lVar10 = (long)(iVar8 * 3);
  lVar9 = (long)(iVar8 * 7);
  dVar19 = a[lVar10 + -2] + a[lVar9 + -2];
  dVar22 = a[lVar10 + -1] + a[lVar9 + -1];
  dVar30 = a[lVar10 + -2] - a[lVar9 + -2];
  dVar33 = a[lVar10 + -1] - a[lVar9 + -1];
  a[lVar4] = dVar37 + dVar19;
  a[(long)iVar8 + -1] = dVar40 - dVar22;
  a[lVar10 + -2] = dVar37 - dVar19;
  a[lVar10 + -1] = dVar22 + dVar40;
  dVar37 = dVar25 + dVar33;
  dVar40 = dVar27 + dVar30;
  a[lVar13 + -2] = dVar42 * dVar37 - dVar40 * dVar20;
  a[lVar13 + -1] = dVar37 * dVar20 + dVar42 * dVar40;
  dVar25 = dVar25 - dVar33;
  dVar27 = dVar27 - dVar30;
  a[lVar9 + -2] = dVar41 * dVar25 + dVar23 * dVar27;
  a[lVar9 + -1] = dVar27 * dVar41 - dVar25 * dVar23;
  dVar37 = a[iVar8] + a[lVar13];
  dVar40 = -a[(long)iVar8 + 1] - a[lVar13 + 1];
  dVar25 = a[iVar8] - a[lVar13];
  dVar27 = a[lVar13 + 1] - a[(long)iVar8 + 1];
  dVar19 = a[lVar10] + a[lVar9];
  dVar22 = a[lVar10 + 1] + a[lVar9 + 1];
  dVar30 = a[lVar10] - a[lVar9];
  dVar33 = a[lVar10 + 1] - a[lVar9 + 1];
  a[iVar8] = dVar37 + dVar19;
  a[(long)iVar8 + 1] = dVar40 - dVar22;
  a[lVar10] = dVar37 - dVar19;
  a[lVar10 + 1] = dVar22 + dVar40;
  dVar37 = dVar25 + dVar33;
  dVar40 = dVar27 + dVar30;
  a[lVar13] = (dVar37 - dVar40) * dVar17;
  a[lVar13 + 1] = (dVar40 + dVar37) * dVar17;
  dVar25 = dVar25 - dVar33;
  dVar27 = dVar27 - dVar30;
  a[lVar9] = (dVar27 + dVar25) * -dVar17;
  a[lVar9 + 1] = (dVar27 - dVar25) * -dVar17;
  dVar33 = a[(long)iVar8 + 2] + a[lVar13 + 2];
  dVar37 = -a[(long)iVar8 + 3] - a[lVar13 + 3];
  dVar17 = a[(long)iVar8 + 2] - a[lVar13 + 2];
  dVar25 = a[lVar13 + 3] - a[(long)iVar8 + 3];
  dVar40 = a[lVar10 + 2] + a[lVar9 + 2];
  dVar19 = a[lVar10 + 3] + a[lVar9 + 3];
  dVar27 = a[lVar10 + 2] - a[lVar9 + 2];
  dVar30 = a[lVar10 + 3] - a[lVar9 + 3];
  a[(long)iVar8 + 2] = dVar33 + dVar40;
  a[(long)iVar8 + 3] = dVar37 - dVar19;
  a[lVar10 + 2] = dVar33 - dVar40;
  a[lVar10 + 3] = dVar19 + dVar37;
  dVar33 = dVar17 + dVar30;
  dVar37 = dVar25 + dVar27;
  a[lVar13 + 2] = dVar20 * dVar33 - dVar37 * dVar42;
  a[lVar13 + 3] = dVar37 * dVar20 + dVar33 * dVar42;
  dVar17 = dVar17 - dVar30;
  dVar25 = dVar25 - dVar27;
  a[lVar9 + 2] = dVar23 * dVar17 + dVar41 * dVar25;
  a[lVar9 + 3] = dVar25 * dVar23 - dVar17 * dVar41;
  return;
}

Assistant:

void cftb1st(int n, FFTFLT *a, FFTFLT *w)
{
    int j, j0, j1, j2, j3, k, m, mh;
    FFTFLT wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
        wd1r, wd1i, wd3r, wd3i;
    FFTFLT x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
        y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

    mh = n >> 3;
    m = 2 * mh;
    j1 = m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[0] + a[j2];
    x0i = -a[1] - a[j2 + 1];
    x1r = a[0] - a[j2];
    x1i = -a[1] + a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[0] = x0r + x2r;
    a[1] = x0i - x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j2] = x1r + x3i;
    a[j2 + 1] = x1i + x3r;
    a[j3] = x1r - x3i;
    a[j3 + 1] = x1i - x3r;
    wn4r = w[1];
    csc1 = w[2];
    csc3 = w[3];
    wd1r = 1;
    wd1i = 0;
    wd3r = 1;
    wd3i = 0;
    k = 0;
    for (j = 2; j < mh - 2; j += 4) {
        k += 4;
        wk1r = csc1 * (wd1r + w[k]);
        wk1i = csc1 * (wd1i + w[k + 1]);
        wk3r = csc3 * (wd3r + w[k + 2]);
        wk3i = csc3 * (wd3i + w[k + 3]);
        wd1r = w[k];
        wd1i = w[k + 1];
        wd3r = w[k + 2];
        wd3i = w[k + 3];
        j1 = j + m;
        j2 = j1 + m;
        j3 = j2 + m;
        x0r = a[j] + a[j2];
        x0i = -a[j + 1] - a[j2 + 1];
        x1r = a[j] - a[j2];
        x1i = -a[j + 1] + a[j2 + 1];
        y0r = a[j + 2] + a[j2 + 2];
        y0i = -a[j + 3] - a[j2 + 3];
        y1r = a[j + 2] - a[j2 + 2];
        y1i = -a[j + 3] + a[j2 + 3];
        x2r = a[j1] + a[j3];
        x2i = a[j1 + 1] + a[j3 + 1];
        x3r = a[j1] - a[j3];
        x3i = a[j1 + 1] - a[j3 + 1];
        y2r = a[j1 + 2] + a[j3 + 2];
        y2i = a[j1 + 3] + a[j3 + 3];
        y3r = a[j1 + 2] - a[j3 + 2];
        y3i = a[j1 + 3] - a[j3 + 3];
        a[j] = x0r + x2r;
        a[j + 1] = x0i - x2i;
        a[j + 2] = y0r + y2r;
        a[j + 3] = y0i - y2i;
        a[j1] = x0r - x2r;
        a[j1 + 1] = x0i + x2i;
        a[j1 + 2] = y0r - y2r;
        a[j1 + 3] = y0i + y2i;
        x0r = x1r + x3i;
        x0i = x1i + x3r;
        a[j2] = wk1r * x0r - wk1i * x0i;
        a[j2 + 1] = wk1r * x0i + wk1i * x0r;
        x0r = y1r + y3i;
        x0i = y1i + y3r;
        a[j2 + 2] = wd1r * x0r - wd1i * x0i;
        a[j2 + 3] = wd1r * x0i + wd1i * x0r;
        x0r = x1r - x3i;
        x0i = x1i - x3r;
        a[j3] = wk3r * x0r + wk3i * x0i;
        a[j3 + 1] = wk3r * x0i - wk3i * x0r;
        x0r = y1r - y3i;
        x0i = y1i - y3r;
        a[j3 + 2] = wd3r * x0r + wd3i * x0i;
        a[j3 + 3] = wd3r * x0i - wd3i * x0r;
        j0 = m - j;
        j1 = j0 + m;
        j2 = j1 + m;
        j3 = j2 + m;
        x0r = a[j0] + a[j2];
        x0i = -a[j0 + 1] - a[j2 + 1];
        x1r = a[j0] - a[j2];
        x1i = -a[j0 + 1] + a[j2 + 1];
        y0r = a[j0 - 2] + a[j2 - 2];
        y0i = -a[j0 - 1] - a[j2 - 1];
        y1r = a[j0 - 2] - a[j2 - 2];
        y1i = -a[j0 - 1] + a[j2 - 1];
        x2r = a[j1] + a[j3];
        x2i = a[j1 + 1] + a[j3 + 1];
        x3r = a[j1] - a[j3];
        x3i = a[j1 + 1] - a[j3 + 1];
        y2r = a[j1 - 2] + a[j3 - 2];
        y2i = a[j1 - 1] + a[j3 - 1];
        y3r = a[j1 - 2] - a[j3 - 2];
        y3i = a[j1 - 1] - a[j3 - 1];
        a[j0] = x0r + x2r;
        a[j0 + 1] = x0i - x2i;
        a[j0 - 2] = y0r + y2r;
        a[j0 - 1] = y0i - y2i;
        a[j1] = x0r - x2r;
        a[j1 + 1] = x0i + x2i;
        a[j1 - 2] = y0r - y2r;
        a[j1 - 1] = y0i + y2i;
        x0r = x1r + x3i;
        x0i = x1i + x3r;
        a[j2] = wk1i * x0r - wk1r * x0i;
        a[j2 + 1] = wk1i * x0i + wk1r * x0r;
        x0r = y1r + y3i;
        x0i = y1i + y3r;
        a[j2 - 2] = wd1i * x0r - wd1r * x0i;
        a[j2 - 1] = wd1i * x0i + wd1r * x0r;
        x0r = x1r - x3i;
        x0i = x1i - x3r;
        a[j3] = wk3i * x0r + wk3r * x0i;
        a[j3 + 1] = wk3i * x0i - wk3r * x0r;
        x0r = y1r - y3i;
        x0i = y1i - y3r;
        a[j3 - 2] = wd3i * x0r + wd3r * x0i;
        a[j3 - 1] = wd3i * x0i - wd3r * x0r;
    }
    wk1r = csc1 * (wd1r + wn4r);
    wk1i = csc1 * (wd1i + wn4r);
    wk3r = csc3 * (wd3r - wn4r);
    wk3i = csc3 * (wd3i - wn4r);
    j0 = mh;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0 - 2] + a[j2 - 2];
    x0i = -a[j0 - 1] - a[j2 - 1];
    x1r = a[j0 - 2] - a[j2 - 2];
    x1i = -a[j0 - 1] + a[j2 - 1];
    x2r = a[j1 - 2] + a[j3 - 2];
    x2i = a[j1 - 1] + a[j3 - 1];
    x3r = a[j1 - 2] - a[j3 - 2];
    x3i = a[j1 - 1] - a[j3 - 1];
    a[j0 - 2] = x0r + x2r;
    a[j0 - 1] = x0i - x2i;
    a[j1 - 2] = x0r - x2r;
    a[j1 - 1] = x0i + x2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2 - 2] = wk1r * x0r - wk1i * x0i;
    a[j2 - 1] = wk1r * x0i + wk1i * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3 - 2] = wk3r * x0r + wk3i * x0i;
    a[j3 - 1] = wk3r * x0i - wk3i * x0r;
    x0r = a[j0] + a[j2];
    x0i = -a[j0 + 1] - a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = -a[j0 + 1] + a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i - x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wn4r * (x0r - x0i);
    a[j2 + 1] = wn4r * (x0i + x0r);
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = -wn4r * (x0r + x0i);
    a[j3 + 1] = -wn4r * (x0i - x0r);
    x0r = a[j0 + 2] + a[j2 + 2];
    x0i = -a[j0 + 3] - a[j2 + 3];
    x1r = a[j0 + 2] - a[j2 + 2];
    x1i = -a[j0 + 3] + a[j2 + 3];
    x2r = a[j1 + 2] + a[j3 + 2];
    x2i = a[j1 + 3] + a[j3 + 3];
    x3r = a[j1 + 2] - a[j3 + 2];
    x3i = a[j1 + 3] - a[j3 + 3];
    a[j0 + 2] = x0r + x2r;
    a[j0 + 3] = x0i - x2i;
    a[j1 + 2] = x0r - x2r;
    a[j1 + 3] = x0i + x2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2 + 2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 3] = wk1i * x0i + wk1r * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3 + 2] = wk3i * x0r + wk3r * x0i;
    a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}